

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHessian.cpp
# Opt level: O3

void __thiscall HighsHessian::deleteCols(HighsHessian *this,HighsIndexCollection *index_collection)

{
  double dVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  pointer pdVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  HighsInt keep_to_col;
  HighsInt delete_from_col;
  HighsInt to_k;
  HighsInt from_k;
  HighsInt current_set_entry;
  HighsInt keep_from_col;
  HighsInt delete_to_col;
  vector<int,_std::allocator<int>_> new_index;
  vector<int,_std::allocator<int>_> save_start;
  HighsInt local_84;
  int local_80;
  int local_7c;
  int local_78;
  HighsInt local_74;
  int local_70;
  HighsInt local_6c;
  vector<int,_std::allocator<int>_> local_68;
  HighsIndexCollection *local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  if (this->dim_ == 0) {
    return;
  }
  limits(index_collection,&local_78,&local_7c);
  if (local_7c < local_78) {
    return;
  }
  local_84 = -1;
  local_74 = 0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&local_68,(long)this->dim_,(value_type_conflict2 *)&local_48);
  if (local_78 <= local_7c) {
    iVar13 = 0;
    iVar12 = local_78;
    do {
      updateOutInIndex(index_collection,&local_80,&local_6c,&local_70,&local_84,&local_74);
      if ((iVar12 == local_78) && (0 < local_80)) {
        lVar8 = 0;
        do {
          local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar8] = iVar13 + (int)lVar8;
          lVar8 = lVar8 + 1;
        } while (lVar8 < local_80);
        iVar13 = iVar13 + (int)lVar8;
      }
      if (local_70 <= local_84) {
        lVar8 = (long)local_70 + -1;
        do {
          local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar8 + 1] = iVar13;
          iVar13 = iVar13 + 1;
          lVar8 = lVar8 + 1;
        } while (lVar8 < local_84);
      }
    } while ((local_84 < this->dim_ + -1) && (bVar6 = iVar12 < local_7c, iVar12 = iVar12 + 1, bVar6)
            );
  }
  local_84 = -1;
  local_74 = 0;
  std::vector<int,_std::allocator<int>_>::vector(&local_48,&this->start_);
  if (local_7c < local_78) {
    this->dim_ = 0;
  }
  else {
    iVar14 = 0;
    iVar13 = 0;
    lVar8 = 0;
    iVar12 = local_78;
    local_50 = index_collection;
    do {
      updateOutInIndex(index_collection,&local_80,&local_6c,&local_70,&local_84,&local_74);
      if ((iVar12 == local_78) && (0 < local_80)) {
        lVar7 = CONCAT44(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_);
        piVar3 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar4 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar8 = (long)(int)lVar8;
        lVar9 = 0;
        do {
          iVar2 = *(int *)(lVar7 + lVar9 * 4);
          lVar10 = (long)iVar2;
          iVar11 = *(int *)(lVar7 + 4 + lVar9 * 4);
          lVar9 = lVar9 + 1;
          if (iVar2 < iVar11) {
            pdVar5 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            do {
              if (-1 < local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[piVar4[lVar10]]) {
                piVar4[iVar14] =
                     local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[piVar4[lVar10]];
                dVar1 = pdVar5[lVar10];
                pdVar5[iVar14] = dVar1;
                iVar13 = iVar13 + (uint)(dVar1 != 0.0);
                iVar14 = iVar14 + 1;
                iVar11 = *(int *)(lVar7 + lVar9 * 4);
              }
              lVar10 = lVar10 + 1;
            } while (lVar10 < iVar11);
          }
          piVar3[lVar8 + 1] = iVar14;
          lVar8 = lVar8 + 1;
        } while (lVar9 < local_80);
      }
      if (local_70 <= local_84) {
        lVar7 = CONCAT44(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_);
        piVar3 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar4 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar8 = (long)(int)lVar8;
        lVar9 = (long)local_70;
        do {
          iVar2 = *(int *)(lVar7 + lVar9 * 4);
          lVar10 = (long)iVar2;
          iVar11 = *(int *)(lVar7 + 4 + lVar9 * 4);
          if (iVar2 < iVar11) {
            pdVar5 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            do {
              if (-1 < local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[piVar4[lVar10]]) {
                piVar4[iVar14] =
                     local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[piVar4[lVar10]];
                dVar1 = pdVar5[lVar10];
                pdVar5[iVar14] = dVar1;
                iVar13 = iVar13 + (uint)(dVar1 != 0.0);
                iVar14 = iVar14 + 1;
                iVar11 = *(int *)(lVar7 + (lVar9 + 1) * 4);
              }
              lVar10 = lVar10 + 1;
            } while (lVar10 < iVar11);
          }
          piVar3[lVar8 + 1] = iVar14;
          lVar8 = lVar8 + 1;
          bVar6 = lVar9 < local_84;
          lVar9 = lVar9 + 1;
          index_collection = local_50;
        } while (bVar6);
      }
    } while ((local_84 < this->dim_ + -1) && (bVar6 = iVar12 < local_7c, iVar12 = iVar12 + 1, bVar6)
            );
    this->dim_ = (HighsInt)lVar8;
    if (iVar13 != 0) {
      exactResize(this);
      goto LAB_002f1262;
    }
  }
  clear(this);
LAB_002f1262:
  if ((void *)CONCAT44(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_));
  }
  if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HighsHessian::deleteCols(const HighsIndexCollection& index_collection) {
  if (this->dim_ == 0) return;
  // Can't handle non-triangular matrices yet
  assert(this->format_ == HessianFormat::kTriangular);
  assert(ok(index_collection));
  HighsInt from_k;
  HighsInt to_k;
  limits(index_collection, from_k, to_k);
  if (from_k > to_k) return;
  HighsInt delete_from_col;
  HighsInt delete_to_col;
  HighsInt keep_from_col;
  HighsInt keep_to_col = -1;
  HighsInt current_set_entry = 0;

  // Initial pass creates a look-up to for the new index of columns
  // being retained, and -1 for columns being deleted
  std::vector<HighsInt> new_index;
  new_index.assign(this->dim_, -1);
  HighsInt new_dim = 0;
  for (HighsInt k = from_k; k <= to_k; k++) {
    updateOutInIndex(index_collection, delete_from_col, delete_to_col,
                     keep_from_col, keep_to_col, current_set_entry);
    if (k == from_k) {
      // Account for the initial columns being kept
      for (HighsInt iCol = 0; iCol < delete_from_col; iCol++)
        new_index[iCol] = new_dim++;
    }
    for (HighsInt iCol = keep_from_col; iCol <= keep_to_col; iCol++)
      new_index[iCol] = new_dim++;
    // When using a mask, to_k = this->dim_, but consecutive
    // keep/delete entries are accumulated, so may not need all passes
    if (keep_to_col >= this->dim_ - 1) break;
  }
  assert(new_dim < this->dim_);
  // Now perform the pass that deletes rows/columns
  keep_to_col = -1;
  current_set_entry = 0;
  // Have to accumulate new number of entries from the outset, as
  // entries may be lost from columns being kept before any are
  // deleted. Also keep a count of the number of nonzeros, in case the new
  HighsInt check_new_dim = new_dim;
  new_dim = 0;
  HighsInt new_num_nz = 0;
  HighsInt new_num_entries = 0;
  std::vector<HighsInt> save_start = this->start_;
  for (HighsInt k = from_k; k <= to_k; k++) {
    updateOutInIndex(index_collection, delete_from_col, delete_to_col,
                     keep_from_col, keep_to_col, current_set_entry);
    if (k == from_k) {
      // Account for the initial columns being kept
      for (HighsInt iCol = 0; iCol < delete_from_col; iCol++) {
        assert(new_index[iCol] >= 0);
        for (HighsInt iEl = save_start[iCol]; iEl < save_start[iCol + 1];
             iEl++) {
          HighsInt iRow = new_index[this->index_[iEl]];
          if (iRow < 0) continue;
          this->index_[new_num_entries] = iRow;
          this->value_[new_num_entries] = this->value_[iEl];
          if (this->value_[new_num_entries]) new_num_nz++;
          new_num_entries++;
        }
        new_dim++;
        this->start_[new_dim] = new_num_entries;
      }
      assert(new_dim == delete_from_col);
    }
    for (HighsInt iCol = keep_from_col; iCol <= keep_to_col; iCol++) {
      assert(new_index[iCol] >= 0);
      for (HighsInt iEl = save_start[iCol]; iEl < save_start[iCol + 1]; iEl++) {
        HighsInt iRow = new_index[this->index_[iEl]];
        if (iRow < 0) continue;
        this->index_[new_num_entries] = iRow;
        this->value_[new_num_entries] = this->value_[iEl];
        if (this->value_[new_num_entries]) new_num_nz++;
        new_num_entries++;
      }
      new_dim++;
      this->start_[new_dim] = new_num_entries;
    }
    if (keep_to_col >= this->dim_ - 1) break;
  }
  assert(new_dim == check_new_dim);
  this->dim_ = new_dim;
  if (!new_num_nz) {
    this->clear();
  } else {
    this->exactResize();
  }
}